

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O0

void sbfPool_put(void *data)

{
  int *piVar1;
  long lVar2;
  int64_t iVar3;
  long in_RDI;
  sbfPool pool;
  sbfPoolItem item;
  
  lVar2 = *(long *)(in_RDI + -0x10);
  LOCK();
  piVar1 = (int *)(*(long *)(lVar2 + 0x28) + 0x1c);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  do {
    *(undefined8 *)(in_RDI + -8) = *(undefined8 *)(lVar2 + 0x20);
    iVar3 = sbfAtomic_compareAndSwap
                      ((int64_t *)(lVar2 + 0x20),*(int64_t *)(in_RDI + -8),(int64_t)(in_RDI + -0x10)
                      );
  } while (iVar3 == 0);
  return;
}

Assistant:

static SBF_INLINE void
sbfPool_put (void* data)
{
    sbfPoolItem item = (sbfPoolItem)data - 1;
    sbfPool     pool = item->mPool;

#ifdef WIN32
    InterlockedIncrement (&pool->mCount->mPuts);
#else
    __sync_fetch_and_add (&pool->mCount->mPuts, 1);
#endif

    do
        item->mNext = pool->mFree;
    while (!sbfAtomic_compareAndSwap ((volatile int64_t*)&pool->mFree,
                                      (int64_t)item->mNext,
                                      (int64_t)item));
}